

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckDeclarationOrder.cxx
# Opt level: O0

bool __thiscall
kws::Parser::CheckDeclarationOrder
          (Parser *this,size_t posPublic,size_t posProtected,size_t posPrivate)

{
  long lVar1;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *this_00;
  value_type *__x;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar2;
  Error error_5;
  Error error_4;
  Error error_3;
  Error error_2;
  Error error_1;
  Error error;
  bool hasError;
  size_t privateLast;
  size_t privateFirst;
  size_t protectedLast;
  size_t protectedFirst;
  size_t currentclass;
  size_t class_beg;
  size_t class_end;
  size_t publicLast;
  size_t publicFirst;
  char *val;
  size_t length;
  value_type *in_stack_fffffffffffffdb8;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined1 withoutComments;
  size_t in_stack_fffffffffffffdd0;
  Parser *in_stack_fffffffffffffdd8;
  size_t in_stack_fffffffffffffdf0;
  Parser *in_stack_fffffffffffffdf8;
  bool local_1f2;
  undefined8 in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  Parser *in_stack_fffffffffffffe38;
  string local_190 [8];
  size_t in_stack_fffffffffffffe78;
  size_t *in_stack_fffffffffffffe80;
  size_t *in_stack_fffffffffffffe88;
  Parser *in_stack_fffffffffffffe90;
  string local_158 [32];
  long local_138;
  Parser *local_130;
  undefined8 local_128;
  string local_120 [32];
  long local_100;
  long local_f8;
  undefined8 local_f0;
  string local_e8 [48];
  long local_b8;
  long local_b0;
  undefined8 local_a8;
  string local_a0 [39];
  byte local_79;
  ulong local_70;
  ulong local_60;
  size_t local_58;
  ulong local_50;
  size_t local_48;
  ulong local_38;
  char *local_30;
  undefined8 local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  *(undefined1 *)(in_RDI + 0x38) = 1;
  local_28 = 0xff;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = (char *)operator_new__(0xff);
  snprintf(local_30,0xff,"Declaration order should match ");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x158),local_30);
  if ((local_18 < local_10) && (local_20 < local_18)) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x158),"Private/Protected/Public");
  }
  else if ((local_10 < local_18) && (local_18 < local_20)) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x158),"Public/Protected/Private");
  }
  else if ((local_20 < local_10) && (local_18 < local_20)) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x158),"Protected/Private/Public");
  }
  else if ((local_10 < local_20) && (local_18 < local_20)) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x158),"Protected/Public/Private");
  }
  if (local_30 != (char *)0x0) {
    operator_delete__(local_30);
  }
  FindPublicArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
  local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                             in_stack_fffffffffffffe28,
                             SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  while( true ) {
    local_1f2 = false;
    if ((local_38 != 0xffffffffffffffff) && (local_1f2 = false, local_38 != 99999999)) {
      local_1f2 = local_38 < local_50 || local_48 < local_38;
    }
    if (!local_1f2) break;
    FindPublicArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78);
    local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                               in_stack_fffffffffffffe28,
                               SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  }
  local_58 = local_50;
  FindProtectedArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                    in_stack_fffffffffffffe78);
  local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                             in_stack_fffffffffffffe28,
                             SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  while( true ) {
    bVar2 = false;
    if ((local_60 != 0xffffffffffffffff) && (bVar2 = false, local_60 != 99999999)) {
      bVar2 = local_50 != local_58;
    }
    if (!bVar2) break;
    FindProtectedArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe78);
    local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                               in_stack_fffffffffffffe28,
                               SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  }
  FindPrivateArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                  in_stack_fffffffffffffe78);
  local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                             (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                             in_stack_fffffffffffffe28,
                             SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  while( true ) {
    withoutComments = (undefined1)((ulong)in_stack_fffffffffffffdc8 >> 0x38);
    bVar2 = false;
    if ((local_70 != 0xffffffffffffffff) && (bVar2 = false, local_70 != 99999999)) {
      bVar2 = local_50 != local_58;
    }
    if (!bVar2) break;
    FindPrivateArea(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                    in_stack_fffffffffffffe78);
    local_48 = FindEndOfClass(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    local_50 = FindOpeningChar(in_stack_fffffffffffffe38,
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x38),
                               (char)((ulong)in_stack_fffffffffffffe30 >> 0x30),
                               in_stack_fffffffffffffe28,
                               SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0));
  }
  local_79 = 0;
  if ((((local_18 < local_10) && (local_60 != 99999999)) && (local_38 != 99999999)) &&
     (local_38 < local_60)) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1ab967);
    local_b8 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                             (bool)withoutComments);
    local_b0 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                             (bool)withoutComments);
    local_a8 = 8;
    std::__cxx11::string::operator=(local_a0,"Public defined before Protected");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1aba08);
  }
  else if (((local_10 < local_18) && (local_60 != 99999999)) &&
          ((local_38 != 99999999 && (local_60 < local_38)))) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1aba90);
    local_100 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              (bool)withoutComments);
    local_f8 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                             (bool)withoutComments);
    local_f0 = 8;
    std::__cxx11::string::operator=(local_e8,"Protected defined before Public");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1abb31);
  }
  if (((local_18 < local_20) && (local_60 != 99999999)) &&
     ((local_70 != 99999999 && (local_70 < local_60)))) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1abbb8);
    local_138 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              (bool)withoutComments);
    in_stack_fffffffffffffdd8 =
         (Parser *)
         GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments);
    local_128 = 8;
    local_130 = in_stack_fffffffffffffdd8;
    std::__cxx11::string::operator=(local_120,"Private defined before Protected");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1abc59);
  }
  else if ((((local_18 < local_20) && (local_60 != 99999999)) && (local_70 != 99999999)) &&
          (local_70 < local_60)) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1abce1);
    in_stack_fffffffffffffdd0 =
         GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments);
    lVar1 = GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments)
    ;
    withoutComments = (undefined1)((ulong)lVar1 >> 0x38);
    std::__cxx11::string::operator=(local_158,"Protected defined before Private");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1abd82);
  }
  if (((local_20 < local_10) && (local_70 != 99999999)) &&
     ((local_38 != 99999999 && (local_38 < local_70)))) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1abe09);
    this_00 = (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
              GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                            (bool)withoutComments);
    __x = (value_type *)
          GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments);
    std::__cxx11::string::operator=(local_190,"Public defined before Private");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back(this_00,__x);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1abeaa);
  }
  else if (((local_20 < local_10) && (local_70 != 99999999)) &&
          ((local_38 != 99999999 && (local_38 < local_70)))) {
    ErrorStruct::ErrorStruct((ErrorStruct *)0x1abf2f);
    GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments);
    GetLineNumber(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(bool)withoutComments);
    std::__cxx11::string::operator=
              ((string *)&stack0xfffffffffffffe38,"Private defined before Public");
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_79 = 1;
    ErrorStruct::~ErrorStruct((ErrorStruct *)0x1abfc5);
  }
  return (bool)((local_79 ^ 0xff) & 1);
}

Assistant:

bool Parser::CheckDeclarationOrder(size_t posPublic, size_t posProtected, size_t posPrivate)
{
  m_TestsDone[DECL_ORDER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Declaration order should match ");
  m_TestsDescription[DECL_ORDER] = val;

  if(posPublic>posProtected && posProtected>posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Private/Protected/Public";
    }
  else if(posPublic<posProtected && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Public/Protected/Private";
    }
  else if(posPublic>posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Private/Public";
    } 
  else if(posPublic<posPrivate && posProtected<posPrivate)
    {
    m_TestsDescription[DECL_ORDER] += "Protected/Public/Private";
    }

  delete [] val;

  size_t publicFirst;
  size_t publicLast;
  this->FindPublicArea(publicFirst,publicLast);
  
  size_t class_end = this->FindEndOfClass(publicFirst);
  size_t class_beg = this->FindOpeningChar('}','{',class_end,true);

  // Find the first public declaration
  while(publicFirst!=std::string::npos && publicFirst!=MAX_CHAR && (publicFirst<class_beg || publicFirst>class_end))
    {
    this->FindPublicArea(publicFirst,publicLast,publicFirst+1);
    class_end = this->FindEndOfClass(publicFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  // Currently checking only one class per file (do a loop in the future)
  size_t currentclass = class_beg;

  size_t protectedFirst;
  size_t protectedLast;
  this->FindProtectedArea(protectedFirst,protectedLast);

  class_end = this->FindEndOfClass(protectedFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);
  while(protectedFirst!=std::string::npos && protectedFirst!=MAX_CHAR &&class_beg != currentclass)
    {
    this->FindProtectedArea(protectedFirst,protectedLast,protectedFirst+1);
    class_end = this->FindEndOfClass(protectedFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
  
  size_t privateFirst;
  size_t privateLast;
  this->FindPrivateArea(privateFirst,privateLast);

  class_end = this->FindEndOfClass(privateFirst);
  class_beg = this->FindOpeningChar('}','{',class_end,true);

  while(privateFirst!=std::string::npos && privateFirst!=MAX_CHAR && class_beg != currentclass)
    {
    this->FindPrivateArea(privateFirst,privateLast,privateFirst+1);    
    class_end = this->FindEndOfClass(privateFirst);
    class_beg = this->FindOpeningChar('}','{',class_end,true);
    }
 
  bool hasError = false;

  // public v.s protected
  if( (posPublic > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic < posProtected)
      && (protectedFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (protectedFirst < publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // protected v.s. private
  if( (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(privateFirst,true);
    error.line2 = this->GetLineNumber(privateFirst,true);
    error.number = DECL_ORDER;
    error.description = "Private defined before Protected";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPrivate > posProtected)
      && (protectedFirst != MAX_CHAR)
      && (privateFirst != MAX_CHAR)
      && (protectedFirst > privateFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(protectedFirst,true);
     error.line2 = this->GetLineNumber(protectedFirst,true);
     error.number = DECL_ORDER;
     error.description = "Protected defined before Private";
     m_ErrorList.push_back(error);
     hasError = true;
     }

  // Public v.s. Private
  if( (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
    ) 
    {
    Error error;
    error.line =  this->GetLineNumber(publicFirst,true);
    error.line2 = this->GetLineNumber(publicFirst,true);
    error.number = DECL_ORDER;
    error.description = "Public defined before Private";
    m_ErrorList.push_back(error);
    hasError = true;
    }
  else if(
     (posPublic > posPrivate)
      && (privateFirst != MAX_CHAR)
      && (publicFirst != MAX_CHAR)
      && (privateFirst > publicFirst)
      )
     {
     Error error;
     error.line =  this->GetLineNumber(privateFirst,true);
     error.line2 = this->GetLineNumber(privateFirst,true);
     error.number = DECL_ORDER;
     error.description = "Private defined before Public";
     m_ErrorList.push_back(error);
     hasError = true;
     }
     
  return !hasError;
}